

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void write_svc_vui_parameters_extension(sps_svc_ext_t *sps_svc_ext,bs_t *b)

{
  int i;
  ulong uVar1;
  hrd_t *hrd;
  
  bs_write_ue(b,(uint)(sps_svc_ext->vui).vui_ext_num_entries_minus1);
  hrd = sps_svc_ext->hrd_vcl;
  for (uVar1 = 0; uVar1 <= (sps_svc_ext->vui).vui_ext_num_entries_minus1; uVar1 = uVar1 + 1) {
    bs_write_u(b,3,(uint)(sps_svc_ext->vui).vui_ext_dependency_id[uVar1]);
    bs_write_u(b,4,(uint)(sps_svc_ext->vui).vui_ext_quality_id[uVar1]);
    bs_write_u(b,3,(uint)(sps_svc_ext->vui).vui_ext_temporal_id[uVar1]);
    bs_write_u1(b,(uint)(sps_svc_ext->vui).vui_ext_timing_info_present_flag[uVar1]);
    if ((sps_svc_ext->vui).vui_ext_timing_info_present_flag[uVar1] != '\0') {
      bs_write_u(b,0x20,(sps_svc_ext->vui).vui_ext_num_units_in_tick[uVar1]);
      bs_write_u(b,0x20,(sps_svc_ext->vui).vui_ext_time_scale[uVar1]);
      bs_write_u1(b,(uint)(sps_svc_ext->vui).vui_ext_fixed_frame_rate_flag[uVar1]);
    }
    bs_write_u1(b,(uint)(sps_svc_ext->vui).vui_ext_nal_hrd_parameters_present_flag[uVar1]);
    if ((sps_svc_ext->vui).vui_ext_nal_hrd_parameters_present_flag[uVar1] == true) {
      write_hrd_parameters(hrd,b);
    }
    bs_write_u1(b,(uint)(sps_svc_ext->vui).vui_ext_vcl_hrd_parameters_present_flag[uVar1]);
    if ((sps_svc_ext->vui).vui_ext_vcl_hrd_parameters_present_flag[uVar1] == true) {
      write_hrd_parameters(hrd + -0x80,b);
    }
    if (((sps_svc_ext->vui).vui_ext_nal_hrd_parameters_present_flag[uVar1] != false) ||
       ((sps_svc_ext->vui).vui_ext_vcl_hrd_parameters_present_flag[uVar1] == true)) {
      bs_write_u1(b,(uint)(sps_svc_ext->vui).vui_ext_low_delay_hrd_flag[uVar1]);
    }
    bs_write_u1(b,(uint)(sps_svc_ext->vui).vui_ext_pic_struct_present_flag[uVar1]);
    hrd = hrd + 1;
  }
  return;
}

Assistant:

void write_svc_vui_parameters_extension(sps_svc_ext_t* sps_svc_ext, bs_t* b)
{
    bs_write_ue(b, sps_svc_ext->vui.vui_ext_num_entries_minus1);
    for( int i = 0; i <= sps_svc_ext->vui.vui_ext_num_entries_minus1; i++ )
    {
        bs_write_u(b, 3, sps_svc_ext->vui.vui_ext_dependency_id[i]);
        bs_write_u(b, 4, sps_svc_ext->vui.vui_ext_quality_id[i]);
        bs_write_u(b, 3, sps_svc_ext->vui.vui_ext_temporal_id[i]);
        bs_write_u1(b, sps_svc_ext->vui.vui_ext_timing_info_present_flag[i]);
        if( sps_svc_ext->vui.vui_ext_timing_info_present_flag[i] )
        {
            bs_write_u(b, 32, sps_svc_ext->vui.vui_ext_num_units_in_tick[i]);
            bs_write_u(b, 32, sps_svc_ext->vui.vui_ext_time_scale[i]);
            bs_write_u1(b, sps_svc_ext->vui.vui_ext_fixed_frame_rate_flag[i]);
        }

        bs_write_u1(b, sps_svc_ext->vui.vui_ext_nal_hrd_parameters_present_flag[i]);
        if( sps_svc_ext->vui.vui_ext_nal_hrd_parameters_present_flag[i] )
        {
            write_hrd_parameters(&sps_svc_ext->hrd_vcl[i], b);
        }
        bs_write_u1(b, sps_svc_ext->vui.vui_ext_vcl_hrd_parameters_present_flag[i]);
        if( sps_svc_ext->vui.vui_ext_vcl_hrd_parameters_present_flag[i] )
        {
            write_hrd_parameters(&sps_svc_ext->hrd_nal[i], b);
        }
        
        if( sps_svc_ext->vui.vui_ext_nal_hrd_parameters_present_flag[i] ||
            sps_svc_ext->vui.vui_ext_vcl_hrd_parameters_present_flag[i] )
        {
            bs_write_u1(b, sps_svc_ext->vui.vui_ext_low_delay_hrd_flag[i]);
        }
        bs_write_u1(b, sps_svc_ext->vui.vui_ext_pic_struct_present_flag[i]);
    }
}